

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::ELU_x86_fma::forward_inplace(ELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [24];
  long *in_RSI;
  long in_RDI;
  float fVar44;
  float fVar45;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  __m128 _p_1;
  __m128 _alpha128;
  __m256 _p;
  __m256 _alpha256;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 neg;
  __m256 pos;
  __m128 neg_1;
  __m128 pos_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  int local_1420;
  undefined8 local_1410;
  undefined8 local_1408;
  undefined8 local_1400;
  undefined4 local_13f8;
  long local_13f0;
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined4 local_13e0;
  undefined4 local_13dc;
  undefined4 local_13d8;
  undefined8 local_13d0;
  undefined1 (*local_13c8) [32];
  int local_13bc;
  int local_13b8;
  int local_13b4;
  int local_13b0;
  int local_13ac;
  int local_13a8;
  int local_13a4;
  long *local_1398;
  undefined1 local_1385;
  int local_1384;
  undefined8 *local_1378;
  undefined8 *local_1370;
  undefined8 *local_1360;
  uint local_134c;
  undefined1 (*local_1348) [32];
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float fStack_1324;
  undefined1 (*local_1308) [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined4 local_1274;
  float local_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float local_125c;
  undefined1 (*local_1258) [32];
  float local_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined1 (*local_1238) [32];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined4 local_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined4 local_11d4;
  long local_11d0;
  undefined4 local_11c4;
  long local_11c0;
  undefined1 (*local_11b8) [32];
  undefined4 local_11ac;
  int local_11a8;
  int local_11a4;
  undefined8 *local_11a0;
  undefined4 local_1194;
  long local_1190;
  undefined8 *local_1170;
  undefined1 local_1140 [32];
  undefined4 local_1120;
  undefined4 local_111c;
  undefined4 local_1118;
  undefined4 local_1114;
  undefined4 local_1110;
  undefined4 local_110c;
  undefined4 local_1108;
  undefined4 local_1104;
  undefined1 local_1100 [32];
  uint local_10e0;
  uint local_10dc;
  uint local_10d8;
  uint local_10d4;
  uint local_10d0;
  uint local_10cc;
  uint local_10c8;
  uint local_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  ulong uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  ulong uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined1 local_fa0 [8];
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [32];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined1 local_f20 [32];
  undefined1 local_f00 [8];
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined1 local_ee0 [32];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined1 local_e80 [32];
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  float local_da0;
  float fStack_d9c;
  float fStack_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float fStack_d88;
  float fStack_d84;
  undefined1 local_d80 [8];
  float fStack_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float fStack_d68;
  float fStack_d64;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined1 *local_c88;
  undefined1 *local_c80;
  undefined1 *local_c78;
  float *local_c70;
  undefined1 *local_c68;
  undefined1 *local_c60;
  float *local_c58;
  undefined1 *local_c50;
  undefined1 *local_c48;
  float *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  float *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  float *local_c10;
  undefined1 *local_c08;
  undefined1 *local_c00;
  float *local_bf8;
  float *local_bf0;
  undefined1 *local_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 *local_b90;
  float *local_b88;
  undefined1 *local_b80;
  undefined1 *local_b78;
  float *local_b70;
  undefined1 *local_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined4 local_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960 [2];
  float afStack_958 [2];
  float afStack_950 [2];
  float afStack_948 [2];
  float local_940 [2];
  float afStack_938 [2];
  float afStack_930 [2];
  float afStack_928 [2];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float local_900 [2];
  float afStack_8f8 [2];
  float afStack_8f0 [2];
  float afStack_8e8 [2];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0 [2];
  float afStack_898 [2];
  float afStack_890 [2];
  float afStack_888 [2];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  float local_840 [2];
  float afStack_838 [2];
  float afStack_830 [2];
  float afStack_828 [2];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0 [2];
  float afStack_7d8 [2];
  float afStack_7d0 [2];
  float afStack_7c8 [2];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  float local_780 [2];
  float afStack_778 [2];
  float afStack_770 [2];
  float afStack_768 [2];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0 [2];
  float afStack_698 [2];
  float afStack_690 [2];
  float afStack_688 [2];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  float local_640 [2];
  float afStack_638 [2];
  float afStack_630 [2];
  float afStack_628 [2];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined4 local_5b4;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined4 local_594;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  ulong uStack_568;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  ulong uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined1 local_4f0 [8];
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [8];
  undefined8 uStack_4a8;
  undefined1 local_4a0 [8];
  undefined8 uStack_498;
  undefined1 local_490 [16];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined4 local_454;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 *local_280;
  float *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  float *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  float *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  float *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  float *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  float *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  float *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  float local_f0 [2];
  float afStack_e8 [2];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  float local_c0 [2];
  float afStack_b8 [2];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  float local_90 [2];
  float afStack_88 [2];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_13a4 = *(int *)((long)in_RSI + 0x2c);
  local_13a8 = (int)in_RSI[6];
  local_13ac = *(int *)((long)in_RSI + 0x34);
  local_13b0 = (int)in_RSI[7];
  local_13b4 = (int)in_RSI[3];
  local_13b8 = local_13a4 * local_13a8 * local_13ac * local_13b4;
  local_1398 = in_RSI;
  for (local_13bc = 0; local_13bc < local_13b0; local_13bc = local_13bc + 1) {
    local_1378 = &local_1410;
    local_11a4 = *(int *)((long)local_1398 + 0x2c);
    local_11a8 = (int)local_1398[6];
    local_11ac = *(undefined4 *)((long)local_1398 + 0x34);
    local_11b8 = (undefined1 (*) [32])
                 (*local_1398 + local_1398[8] * (long)local_13bc * local_1398[2]);
    local_11c0 = local_1398[2];
    local_11c4 = (undefined4)local_1398[3];
    local_11d0 = local_1398[4];
    local_11a0 = &local_1410;
    local_1190 = (long)local_11a4 * (long)local_11a8 * local_11c0;
    local_1370 = &local_1410;
    local_1360 = &local_1410;
    local_1194 = 0x10;
    local_1384 = local_13bc;
    local_1385 = 1;
    local_1410 = 0;
    local_1400 = 0;
    local_13f8 = 0;
    local_13e8 = 0;
    local_13e4 = 0;
    local_13e0 = 0;
    local_13dc = 0;
    local_13d8 = 0;
    local_13d0 = 0;
    local_1408 = 0;
    local_1420 = 0;
    local_134c = *(uint *)(in_RDI + 0xd0);
    auVar1 = vinsertps_avx(ZEXT416(local_134c),ZEXT416(local_134c),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_134c),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_134c),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_134c),ZEXT416(local_134c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_134c),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_134c),0x30);
    auVar41._16_16_ = auVar1;
    auVar41._0_16_ = auVar2;
    local_1100._0_8_ = auVar2._0_8_;
    local_1100._8_8_ = auVar2._8_8_;
    local_1100._16_8_ = auVar1._0_8_;
    local_1100._24_8_ = auVar1._8_8_;
    local_13c8 = local_11b8;
    for (; local_1420 + 7 < local_13b8; local_1420 = local_1420 + 8) {
      local_1348 = local_13c8;
      local_12a0 = *(undefined8 *)*local_13c8;
      uStack_1298 = *(undefined8 *)(*local_13c8 + 8);
      uStack_1290 = *(undefined8 *)(*local_13c8 + 0x10);
      uStack_1288 = *(undefined8 *)(*local_13c8 + 0x18);
      local_1308 = local_13c8;
      local_12c0 = local_1100._0_8_;
      uStack_12b8 = local_1100._8_8_;
      uStack_12b0 = local_1100._16_8_;
      uStack_12a8 = local_1100._24_8_;
      local_1080 = ZEXT832(0) << 0x20;
      local_10a0 = 0;
      local_1060._8_8_ = SUB328(ZEXT832(0),4);
      uStack_1098 = local_1060._8_8_;
      uStack_1090 = 0;
      uStack_1088 = 0;
      local_12e0 = vmaxps_avx(ZEXT832((ulong)local_1060._8_8_) << 0x40,*local_13c8);
      local_1020 = 0;
      uStack_1018 = local_1060._8_8_;
      uStack_1010 = 0;
      uStack_1008 = 0;
      auVar5 = vminps_avx(ZEXT832((ulong)local_1060._8_8_) << 0x40,*local_13c8);
      local_1300._0_8_ = auVar5._0_8_;
      local_1300._8_8_ = auVar5._8_8_;
      local_1300._16_8_ = auVar5._16_8_;
      local_1300._24_8_ = auVar5._24_8_;
      local_e80 = ZEXT832(0) << 0x20;
      local_f60 = 0x3f8000003f800000;
      uStack_f58 = 0x3f8000003f800000;
      uStack_f50 = 0x3f8000003f800000;
      uStack_f48 = 0x3f8000003f800000;
      local_e40 = local_1300._0_8_;
      uStack_e38 = local_1300._8_8_;
      uStack_e30 = local_1300._16_8_;
      uStack_e28 = local_1300._24_8_;
      local_e60 = 0x42b0c0a542b0c0a5;
      uStack_e58 = 0x42b0c0a542b0c0a5;
      uStack_e50 = 0x42b0c0a542b0c0a5;
      uStack_e48 = 0x42b0c0a542b0c0a5;
      auVar12._8_8_ = 0x42b0c0a542b0c0a5;
      auVar12._0_8_ = 0x42b0c0a542b0c0a5;
      auVar12._16_8_ = 0x42b0c0a542b0c0a5;
      auVar12._24_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(auVar5,auVar12);
      local_ee0._0_8_ = auVar5._0_8_;
      local_ea0 = local_ee0._0_8_;
      local_ee0._8_8_ = auVar5._8_8_;
      uStack_e98 = local_ee0._8_8_;
      local_ee0._16_8_ = auVar5._16_8_;
      uStack_e90 = local_ee0._16_8_;
      local_ee0._24_8_ = auVar5._24_8_;
      uStack_e88 = local_ee0._24_8_;
      local_ec0 = 0xc2b0c0a5c2b0c0a5;
      uStack_eb8 = 0xc2b0c0a5c2b0c0a5;
      uStack_eb0 = 0xc2b0c0a5c2b0c0a5;
      uStack_ea8 = 0xc2b0c0a5c2b0c0a5;
      auVar6._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar5,auVar6);
      local_c88 = local_ee0;
      local_bf0 = ::_ps256_cephes_LOG2EF;
      local_bf8 = ::_ps256_0p5;
      local_ee0._0_8_ = auVar4._0_8_;
      local_920 = local_ee0._0_8_;
      local_ee0._8_8_ = auVar4._8_8_;
      uStack_918 = local_ee0._8_8_;
      local_ee0._16_8_ = auVar4._16_8_;
      uStack_910 = local_ee0._16_8_;
      local_ee0._24_8_ = auVar4._24_8_;
      uStack_908 = local_ee0._24_8_;
      local_940[0] = 1.442695;
      local_940[1] = 1.442695;
      afStack_938[0] = 1.442695;
      afStack_938[1] = 1.442695;
      afStack_930[0] = 1.442695;
      afStack_930[1] = 1.442695;
      afStack_928[0] = 1.442695;
      afStack_928[1] = 1.442695;
      local_960[0] = 0.5;
      local_960[1] = 0.5;
      afStack_958[0] = 0.5;
      afStack_958[1] = 0.5;
      afStack_950[0] = 0.5;
      afStack_950[1] = 0.5;
      afStack_948[0] = 0.5;
      afStack_948[1] = 0.5;
      auVar14._8_4_ = 1.442695;
      auVar14._12_4_ = 1.442695;
      auVar14._0_4_ = 1.442695;
      auVar14._4_4_ = 1.442695;
      auVar14._16_4_ = 1.442695;
      auVar14._20_4_ = 1.442695;
      auVar14._24_4_ = 1.442695;
      auVar14._28_4_ = 1.442695;
      auVar13._8_4_ = 0.5;
      auVar13._12_4_ = 0.5;
      auVar13._0_4_ = 0.5;
      auVar13._4_4_ = 0.5;
      auVar13._16_4_ = 0.5;
      auVar13._20_4_ = 0.5;
      auVar13._24_4_ = 0.5;
      auVar13._28_4_ = 0.5;
      auVar7 = vfmadd213ps_fma(auVar14,auVar4,auVar13);
      auVar6 = vroundps_avx(ZEXT1632(auVar7),1);
      auVar5 = vcmpps_avx(ZEXT1632(auVar7),auVar6,1);
      local_f80._0_8_ = auVar5._0_8_;
      local_bc0 = local_f80._0_8_;
      local_f80._8_8_ = auVar5._8_8_;
      uStack_bb8 = local_f80._8_8_;
      local_f80._16_8_ = auVar5._16_8_;
      uStack_bb0 = local_f80._16_8_;
      local_f80._24_8_ = auVar5._24_8_;
      uStack_ba8 = local_f80._24_8_;
      local_be0 = 0x3f8000003f800000;
      uStack_bd8 = 0x3f8000003f800000;
      uStack_bd0 = 0x3f8000003f800000;
      uStack_bc8 = 0x3f8000003f800000;
      auVar42._8_8_ = 0x3f8000003f800000;
      auVar42._0_8_ = 0x3f8000003f800000;
      auVar42._16_8_ = 0x3f8000003f800000;
      auVar42._24_8_ = 0x3f8000003f800000;
      local_f80 = vandps_avx(auVar5,auVar42);
      local_f00 = auVar6._0_8_;
      local_e00 = local_f00;
      uStack_ef8 = auVar6._8_8_;
      uStack_df8 = uStack_ef8;
      uStack_ef0 = auVar6._16_8_;
      uStack_df0 = uStack_ef0;
      uStack_ee8 = auVar6._24_8_;
      uStack_de8 = uStack_ee8;
      local_e20 = local_f80._0_8_;
      uStack_e18 = local_f80._8_8_;
      uStack_e10 = local_f80._16_8_;
      uStack_e08 = local_f80._24_8_;
      local_f20 = vsubps_avx(auVar6,local_f80);
      local_b80 = local_f20;
      local_b70 = ::_ps256_cephes_exp_C1;
      local_680 = local_f20._0_8_;
      uStack_678 = local_f20._8_8_;
      uStack_670 = local_f20._16_8_;
      uStack_668 = local_f20._24_8_;
      local_6a0[0] = 0.6933594;
      local_6a0[1] = 0.6933594;
      afStack_698[0] = 0.6933594;
      afStack_698[1] = 0.6933594;
      afStack_690[0] = 0.6933594;
      afStack_690[1] = 0.6933594;
      afStack_688[0] = 0.6933594;
      afStack_688[1] = 0.6933594;
      local_6c0 = local_ee0._0_8_;
      uStack_6b8 = local_ee0._8_8_;
      uStack_6b0 = local_ee0._16_8_;
      uStack_6a8 = local_ee0._24_8_;
      auVar20._8_4_ = 0.6933594;
      auVar20._12_4_ = 0.6933594;
      auVar20._0_4_ = 0.6933594;
      auVar20._4_4_ = 0.6933594;
      auVar20._16_4_ = 0.6933594;
      auVar20._20_4_ = 0.6933594;
      auVar20._24_4_ = 0.6933594;
      auVar20._28_4_ = 0.6933594;
      auVar7 = vfnmadd213ps_fma(auVar20,local_f20,auVar4);
      local_b88 = ::_ps256_cephes_exp_C2;
      local_620 = local_f20._0_8_;
      uStack_618 = local_f20._8_8_;
      uStack_610 = local_f20._16_8_;
      uStack_608 = local_f20._24_8_;
      local_640[0] = -0.00021219444;
      local_640[1] = -0.00021219444;
      afStack_638[0] = -0.00021219444;
      afStack_638[1] = -0.00021219444;
      afStack_630[0] = -0.00021219444;
      afStack_630[1] = -0.00021219444;
      afStack_628[0] = -0.00021219444;
      afStack_628[1] = -0.00021219444;
      local_ee0._0_8_ = auVar7._0_8_;
      local_660 = local_ee0._0_8_;
      local_ee0._8_8_ = auVar7._8_8_;
      uStack_658 = local_ee0._8_8_;
      uStack_650 = 0;
      uStack_648 = 0;
      auVar21._8_4_ = -0.00021219444;
      auVar21._12_4_ = -0.00021219444;
      auVar21._0_4_ = -0.00021219444;
      auVar21._4_4_ = -0.00021219444;
      auVar21._16_4_ = -0.00021219444;
      auVar21._20_4_ = -0.00021219444;
      auVar21._24_4_ = -0.00021219444;
      auVar21._28_4_ = -0.00021219444;
      auVar7 = vfnmadd213ps_fma(auVar21,local_f20,ZEXT1632(auVar7));
      auVar42 = ZEXT1632(auVar7);
      local_ee0._0_8_ = auVar7._0_8_;
      local_d20 = local_ee0._0_8_;
      local_ee0._8_8_ = auVar7._8_8_;
      uStack_d18 = local_ee0._8_8_;
      uStack_d10 = 0;
      uStack_d08 = 0;
      local_d00._0_4_ = auVar7._0_4_;
      local_d00._4_4_ = auVar7._4_4_;
      uStack_cf8._0_4_ = auVar7._8_4_;
      uStack_cf8._4_4_ = auVar7._12_4_;
      local_f00._4_4_ = local_d00._4_4_ * local_d00._4_4_;
      local_f00._0_4_ = (float)local_d00 * (float)local_d00;
      local_700 = local_f00;
      uStack_ef8._0_4_ = (float)uStack_cf8 * (float)uStack_cf8;
      uStack_ef8._4_4_ = uStack_cf8._4_4_ * uStack_cf8._4_4_;
      auVar3 = _local_f00;
      _local_f00 = ZEXT1632(_local_f00);
      auVar12 = _local_f00;
      uStack_f98 = 0x3950696739506967;
      local_fa0 = (undefined1  [8])0x3950696739506967;
      uStack_f90 = 0x3950696739506967;
      uStack_f88 = 0x3950696739506967;
      local_c78 = local_fa0;
      local_c10 = ::_ps256_cephes_exp_p1;
      local_8c0 = 0x3950696739506967;
      uStack_8b8 = 0x3950696739506967;
      uStack_8b0 = 0x3950696739506967;
      uStack_8a8 = 0x3950696739506967;
      local_8e0 = local_ee0._0_8_;
      uStack_8d8 = local_ee0._8_8_;
      uStack_8d0 = 0;
      uStack_8c8 = 0;
      local_900[0] = 0.0013981999;
      local_900[1] = 0.0013981999;
      afStack_8f8[0] = 0.0013981999;
      afStack_8f8[1] = 0.0013981999;
      afStack_8f0[0] = 0.0013981999;
      afStack_8f0[1] = 0.0013981999;
      afStack_8e8[0] = 0.0013981999;
      afStack_8e8[1] = 0.0013981999;
      auVar15._8_4_ = 0.0013981999;
      auVar15._12_4_ = 0.0013981999;
      auVar15._0_4_ = 0.0013981999;
      auVar15._4_4_ = 0.0013981999;
      auVar15._16_4_ = 0.0013981999;
      auVar15._20_4_ = 0.0013981999;
      auVar15._24_4_ = 0.0013981999;
      auVar15._28_4_ = 0.0013981999;
      auVar7 = vfmadd213ps_fma(auVar42,_local_fa0,auVar15);
      local_c28 = ::_ps256_cephes_exp_p2;
      local_fa0 = auVar7._0_8_;
      local_860 = local_fa0;
      uStack_f98 = auVar7._8_8_;
      uStack_858 = uStack_f98;
      uStack_850 = 0;
      uStack_848 = 0;
      local_880 = local_ee0._0_8_;
      uStack_878 = local_ee0._8_8_;
      uStack_870 = 0;
      uStack_868 = 0;
      local_8a0[0] = 0.008333452;
      local_8a0[1] = 0.008333452;
      afStack_898[0] = 0.008333452;
      afStack_898[1] = 0.008333452;
      afStack_890[0] = 0.008333452;
      afStack_890[1] = 0.008333452;
      afStack_888[0] = 0.008333452;
      afStack_888[1] = 0.008333452;
      auVar16._8_4_ = 0.008333452;
      auVar16._12_4_ = 0.008333452;
      auVar16._0_4_ = 0.008333452;
      auVar16._4_4_ = 0.008333452;
      auVar16._16_4_ = 0.008333452;
      auVar16._20_4_ = 0.008333452;
      auVar16._24_4_ = 0.008333452;
      auVar16._28_4_ = 0.008333452;
      auVar7 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar7),auVar16);
      local_c40 = ::_ps256_cephes_exp_p3;
      local_fa0 = auVar7._0_8_;
      local_800 = local_fa0;
      uStack_f98 = auVar7._8_8_;
      uStack_7f8 = uStack_f98;
      uStack_7f0 = 0;
      uStack_7e8 = 0;
      local_820 = local_ee0._0_8_;
      uStack_818 = local_ee0._8_8_;
      uStack_810 = 0;
      uStack_808 = 0;
      local_840[0] = 0.041665796;
      local_840[1] = 0.041665796;
      afStack_838[0] = 0.041665796;
      afStack_838[1] = 0.041665796;
      afStack_830[0] = 0.041665796;
      afStack_830[1] = 0.041665796;
      afStack_828[0] = 0.041665796;
      afStack_828[1] = 0.041665796;
      auVar17._8_4_ = 0.041665796;
      auVar17._12_4_ = 0.041665796;
      auVar17._0_4_ = 0.041665796;
      auVar17._4_4_ = 0.041665796;
      auVar17._16_4_ = 0.041665796;
      auVar17._20_4_ = 0.041665796;
      auVar17._24_4_ = 0.041665796;
      auVar17._28_4_ = 0.041665796;
      auVar7 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar7),auVar17);
      local_c58 = ::_ps256_cephes_exp_p4;
      local_fa0 = auVar7._0_8_;
      local_7a0 = local_fa0;
      uStack_f98 = auVar7._8_8_;
      uStack_798 = uStack_f98;
      uStack_790 = 0;
      uStack_788 = 0;
      local_7c0 = local_ee0._0_8_;
      uStack_7b8 = local_ee0._8_8_;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      local_7e0[0] = 0.16666666;
      local_7e0[1] = 0.16666666;
      afStack_7d8[0] = 0.16666666;
      afStack_7d8[1] = 0.16666666;
      afStack_7d0[0] = 0.16666666;
      afStack_7d0[1] = 0.16666666;
      afStack_7c8[0] = 0.16666666;
      afStack_7c8[1] = 0.16666666;
      auVar18._8_4_ = 0.16666666;
      auVar18._12_4_ = 0.16666666;
      auVar18._0_4_ = 0.16666666;
      auVar18._4_4_ = 0.16666666;
      auVar18._16_4_ = 0.16666666;
      auVar18._20_4_ = 0.16666666;
      auVar18._24_4_ = 0.16666666;
      auVar18._28_4_ = 0.16666666;
      auVar7 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar7),auVar18);
      local_c70 = ::_ps256_cephes_exp_p5;
      local_fa0 = auVar7._0_8_;
      local_740 = local_fa0;
      uStack_f98 = auVar7._8_8_;
      uStack_738 = uStack_f98;
      uStack_730 = 0;
      uStack_728 = 0;
      local_760 = local_ee0._0_8_;
      uStack_758 = local_ee0._8_8_;
      uStack_750 = 0;
      uStack_748 = 0;
      local_780[0] = 0.5;
      local_780[1] = 0.5;
      afStack_778[0] = 0.5;
      afStack_778[1] = 0.5;
      afStack_770[0] = 0.5;
      afStack_770[1] = 0.5;
      afStack_768[0] = 0.5;
      afStack_768[1] = 0.5;
      auVar19._8_4_ = 0.5;
      auVar19._12_4_ = 0.5;
      auVar19._0_4_ = 0.5;
      auVar19._4_4_ = 0.5;
      auVar19._16_4_ = 0.5;
      auVar19._20_4_ = 0.5;
      auVar19._24_4_ = 0.5;
      auVar19._28_4_ = 0.5;
      auVar7 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar7),auVar19);
      local_c80 = local_f00;
      local_fa0 = auVar7._0_8_;
      local_6e0 = local_fa0;
      uStack_f98 = auVar7._8_8_;
      uStack_6d8 = uStack_f98;
      uStack_6d0 = 0;
      uStack_6c8 = 0;
      uStack_ef8 = auVar3._8_8_;
      uStack_6f8 = uStack_ef8;
      uStack_6f0 = 0;
      uStack_6e8 = 0;
      local_720 = local_ee0._0_8_;
      uStack_718 = local_ee0._8_8_;
      uStack_710 = 0;
      uStack_708 = 0;
      auVar7 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar7),auVar42);
      local_fa0 = auVar7._0_8_;
      uVar8 = local_fa0;
      uStack_f98 = auVar7._8_8_;
      uVar9 = uStack_f98;
      uStack_db0 = 0;
      uStack_da8 = 0;
      local_de0 = 0x3f8000003f800000;
      uStack_dd8 = 0x3f8000003f800000;
      uStack_dd0 = 0x3f8000003f800000;
      uStack_dc8 = 0x3f8000003f800000;
      local_dc0._0_4_ = auVar7._0_4_;
      local_dc0._4_4_ = auVar7._4_4_;
      uStack_db8._0_4_ = auVar7._8_4_;
      uStack_db8._4_4_ = auVar7._12_4_;
      local_fa0._4_4_ = local_dc0._4_4_ + 1.0;
      local_fa0._0_4_ = (float)local_dc0 + 1.0;
      uStack_f98._0_4_ = (float)uStack_db8 + 1.0;
      uStack_f98._4_4_ = uStack_db8._4_4_ + 1.0;
      uStack_f90._0_4_ = 0x3f800000;
      uStack_f90._4_4_ = 0x3f800000;
      auVar40 = _local_fa0;
      uStack_f88._0_4_ = 0x3f800000;
      uStack_f88._4_4_ = 0x3f800000;
      auVar5 = _local_fa0;
      local_b60._0_4_ = local_f20._0_4_;
      local_b60._4_4_ = local_f20._4_4_;
      uStack_b58._0_4_ = local_f20._8_4_;
      uStack_b58._4_4_ = local_f20._12_4_;
      uStack_b50._0_4_ = local_f20._16_4_;
      uStack_b50._4_4_ = local_f20._20_4_;
      uStack_b48._0_4_ = local_f20._24_4_;
      uStack_b48._4_4_ = local_f20._28_4_;
      local_f40 = CONCAT44((int)local_b60._4_4_,(int)(float)local_b60);
      uStack_f38 = CONCAT44((int)uStack_b58._4_4_,(int)(float)uStack_b58);
      uStack_f30 = CONCAT44((int)uStack_b50._4_4_,(int)(float)uStack_b50);
      uStack_f28 = CONCAT44((int)uStack_b48._4_4_,(int)(float)uStack_b48);
      local_a60 = local_f40;
      uStack_a58 = uStack_f38;
      uStack_a50 = uStack_f30;
      uStack_a48 = uStack_f28;
      local_a80 = 0x7f0000007f;
      uStack_a78 = 0x7f0000007f;
      uStack_a70 = 0x7f0000007f;
      uStack_a68 = 0x7f0000007f;
      local_b00 = local_f40;
      uStack_af8 = uStack_f38;
      uStack_af0 = uStack_f30;
      uStack_ae8 = uStack_f28;
      local_b20 = 0x7f0000007f;
      uStack_b18 = 0x7f0000007f;
      uStack_b10 = 0x7f0000007f;
      uStack_b08 = 0x7f0000007f;
      local_ab0 = 0x7f0000007f;
      uStack_aa8 = 0x7f0000007f;
      local_ac0 = 0x7f0000007f;
      uStack_ab8 = 0x7f0000007f;
      local_5d0 = local_f40;
      uStack_5c8 = uStack_f38;
      local_5e0 = 0x7f0000007f;
      uStack_5d8 = 0x7f0000007f;
      auVar23._8_8_ = uStack_f38;
      auVar23._0_8_ = local_f40;
      auVar22._8_8_ = 0x7f0000007f;
      auVar22._0_8_ = 0x7f0000007f;
      local_a90 = vpaddd_avx(auVar23,auVar22);
      local_5f0 = uStack_f30;
      uStack_5e8 = uStack_f28;
      local_600 = 0x7f0000007f;
      uStack_5f8 = 0x7f0000007f;
      auVar3._8_8_ = uStack_f28;
      auVar3._0_8_ = uStack_f30;
      auVar7._8_8_ = 0x7f0000007f;
      auVar7._0_8_ = 0x7f0000007f;
      local_aa0 = vpaddd_avx(auVar3,auVar7);
      local_b40 = local_a90._0_8_;
      uStack_b38 = local_a90._8_8_;
      uStack_b30 = local_aa0._0_8_;
      uStack_b28 = local_aa0._8_8_;
      local_ae0 = local_a90._0_8_;
      uStack_ad8 = local_a90._8_8_;
      uStack_ad0 = local_aa0._0_8_;
      uStack_ac8 = local_aa0._8_8_;
      local_9a0 = local_a90._0_8_;
      uStack_998 = local_a90._8_8_;
      uStack_990 = local_aa0._0_8_;
      uStack_988 = local_aa0._8_8_;
      local_9a4 = 0x17;
      local_a20 = local_a90._0_8_;
      uStack_a18 = local_a90._8_8_;
      uStack_a10 = local_aa0._0_8_;
      uStack_a08 = local_aa0._8_8_;
      local_590 = local_a90._0_8_;
      uStack_588 = local_a90._8_8_;
      local_594 = 0x17;
      local_9c0 = vpslld_avx(local_a90,ZEXT416(0x17));
      local_5b0 = local_aa0._0_8_;
      uStack_5a8 = local_aa0._8_8_;
      local_5b4 = 0x17;
      local_9d0 = vpslld_avx(local_aa0,ZEXT416(0x17));
      local_a40 = local_9c0._0_8_;
      uStack_a38 = local_9c0._8_8_;
      uStack_a30 = local_9d0._0_8_;
      uStack_a28 = local_9d0._8_8_;
      local_a00 = local_9c0._0_8_;
      uStack_9f8 = local_9c0._8_8_;
      uStack_9f0 = local_9d0._0_8_;
      uStack_9e8 = local_9d0._8_8_;
      local_f40 = local_9c0._0_8_;
      uStack_f38 = local_9c0._8_8_;
      uStack_f30 = local_9d0._0_8_;
      uStack_f28 = local_9d0._8_8_;
      local_980 = local_9c0._0_8_;
      uStack_978 = local_9c0._8_8_;
      uStack_970 = local_9d0._0_8_;
      uStack_968 = local_9d0._8_8_;
      local_fc0 = local_9c0._0_8_;
      uStack_fb8 = local_9c0._8_8_;
      uStack_fb0 = local_9d0._0_8_;
      uStack_fa8 = local_9d0._8_8_;
      local_d40 = local_fa0;
      uStack_d38 = uStack_f98;
      uStack_f90 = auVar40._16_8_;
      uStack_d30 = uStack_f90;
      uStack_f88 = auVar5._24_8_;
      uStack_d28 = uStack_f88;
      local_d60._0_4_ = local_9c0._0_4_;
      local_d60._4_4_ = local_9c0._4_4_;
      uStack_d58._0_4_ = local_9c0._8_4_;
      uStack_d58._4_4_ = local_9c0._12_4_;
      uStack_d50._0_4_ = local_9d0._0_4_;
      uStack_d50._4_4_ = local_9d0._4_4_;
      uStack_d48._0_4_ = local_9d0._8_4_;
      local_fa0._4_4_ = (local_dc0._4_4_ + 1.0) * local_d60._4_4_;
      local_fa0._0_4_ = ((float)local_dc0 + 1.0) * (float)local_d60;
      uStack_f98._0_4_ = ((float)uStack_db8 + 1.0) * (float)uStack_d58;
      uStack_f98._4_4_ = (uStack_db8._4_4_ + 1.0) * uStack_d58._4_4_;
      uStack_f90._0_4_ = (float)uStack_d50 * 1.0;
      uStack_f90._4_4_ = uStack_d50._4_4_ * 1.0;
      auVar40 = _local_fa0;
      uStack_f88._0_4_ = (float)uStack_d48 * 1.0;
      uStack_f88._4_4_ = 0x3f800000;
      auVar6 = _local_fa0;
      local_fe0 = local_fa0;
      uStack_fd8 = uStack_f98;
      uStack_f90 = auVar40._16_8_;
      uStack_fd0 = uStack_f90;
      uStack_f88 = auVar6._24_8_;
      uStack_fc8 = uStack_f88;
      local_1274 = 0x3f800000;
      local_1120 = 0x3f800000;
      auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar43._16_16_ = auVar7;
      auVar43._0_16_ = auVar3;
      local_1140._0_8_ = auVar3._0_8_;
      local_1000 = local_1140._0_8_;
      local_1140._8_8_ = auVar3._8_8_;
      uStack_ff8 = local_1140._8_8_;
      local_1140._16_8_ = auVar7._0_8_;
      uStack_ff0 = local_1140._16_8_;
      local_1140._24_8_ = auVar7._8_8_;
      uStack_fe8 = local_1140._24_8_;
      auVar4._16_8_ = uStack_f90;
      auVar4._0_16_ = _local_fa0;
      auVar4._24_8_ = uStack_f88;
      auVar5._16_8_ = local_1140._16_8_;
      auVar5._0_16_ = auVar3;
      auVar5._24_8_ = local_1140._24_8_;
      local_1300 = vsubps_avx(auVar4,auVar5);
      local_cc0._0_4_ = auVar2._0_4_;
      local_cc0._4_4_ = auVar2._4_4_;
      uStack_cb8._0_4_ = auVar2._8_4_;
      uStack_cb8._4_4_ = auVar2._12_4_;
      uStack_cb0._0_4_ = auVar1._0_4_;
      uStack_cb0._4_4_ = auVar1._4_4_;
      uStack_ca8._0_4_ = auVar1._8_4_;
      uStack_ca8._4_4_ = auVar1._12_4_;
      fStack_d84 = uStack_ca8._4_4_;
      local_ce0._0_4_ = local_1300._0_4_;
      local_ce0._4_4_ = local_1300._4_4_;
      uStack_cd8._0_4_ = local_1300._8_4_;
      uStack_cd8._4_4_ = local_1300._12_4_;
      uStack_cd0._0_4_ = local_1300._16_4_;
      uStack_cd0._4_4_ = local_1300._20_4_;
      uStack_cc8._0_4_ = local_1300._24_4_;
      local_da0 = (float)local_cc0 * (float)local_ce0;
      fStack_d9c = local_cc0._4_4_ * local_ce0._4_4_;
      fStack_d98 = (float)uStack_cb8 * (float)uStack_cd8;
      fStack_d94 = uStack_cb8._4_4_ * uStack_cd8._4_4_;
      fStack_d90 = (float)uStack_cb0 * (float)uStack_cd0;
      fStack_d8c = uStack_cb0._4_4_ * uStack_cd0._4_4_;
      fStack_d88 = (float)uStack_ca8 * (float)uStack_cc8;
      local_d80._0_4_ = local_12e0._0_4_;
      local_d80._4_4_ = local_12e0._4_4_;
      fStack_d78 = local_12e0._8_4_;
      fStack_d74 = local_12e0._12_4_;
      fStack_d70 = local_12e0._16_4_;
      fStack_d6c = local_12e0._20_4_;
      fStack_d68 = local_12e0._24_4_;
      fStack_d64 = local_12e0._28_4_;
      local_1340 = (float)local_d80._0_4_ + local_da0;
      fStack_133c = (float)local_d80._4_4_ + fStack_d9c;
      fStack_1338 = fStack_d78 + fStack_d98;
      fStack_1334 = fStack_d74 + fStack_d94;
      fStack_1330 = fStack_d70 + fStack_d90;
      fStack_132c = fStack_d6c + fStack_d8c;
      fStack_1328 = fStack_d68 + fStack_d88;
      fStack_1324 = fStack_d64 + uStack_ca8._4_4_;
      *(ulong *)*local_13c8 = CONCAT44(fStack_133c,local_1340);
      *(ulong *)(*local_13c8 + 8) = CONCAT44(fStack_1334,fStack_1338);
      *(ulong *)(*local_13c8 + 0x10) = CONCAT44(fStack_132c,fStack_1330);
      *(ulong *)(*local_13c8 + 0x18) = CONCAT44(fStack_1324,fStack_1328);
      local_13c8 = local_13c8 + 1;
      local_1140 = auVar43;
      local_111c = local_1120;
      local_1118 = local_1120;
      local_1114 = local_1120;
      local_1110 = local_1120;
      local_110c = local_1120;
      local_1108 = local_1120;
      local_1104 = local_1120;
      local_10c0 = local_12a0;
      uStack_10b8 = uStack_1298;
      uStack_10b0 = uStack_1290;
      uStack_10a8 = uStack_1288;
      local_1060 = local_1080;
      local_1040 = local_12a0;
      uStack_1038 = uStack_1298;
      uStack_1030 = uStack_1290;
      uStack_1028 = uStack_1288;
      _local_fa0 = auVar6;
      _local_f00 = auVar12;
      local_ee0 = auVar42;
      local_dc0 = uVar8;
      uStack_db8 = uVar9;
      _local_d80 = local_12e0;
      local_d60 = local_9c0._0_8_;
      uStack_d58 = local_9c0._8_8_;
      uStack_d50 = local_9d0._0_8_;
      uStack_d48 = local_9d0._8_8_;
      local_d00 = local_d20;
      uStack_cf8 = uStack_d18;
      uStack_cf0 = uStack_d10;
      uStack_ce8 = uStack_d08;
      local_ce0 = local_1300._0_8_;
      uStack_cd8 = local_1300._8_8_;
      uStack_cd0 = local_1300._16_8_;
      uStack_cc8 = local_1300._24_8_;
      local_cc0 = local_1100._0_8_;
      uStack_cb8 = local_1100._8_8_;
      uStack_cb0 = local_1100._16_8_;
      uStack_ca8 = local_1100._24_8_;
      local_c68 = local_c88;
      local_c60 = local_c78;
      local_c50 = local_c88;
      local_c48 = local_c78;
      local_c38 = local_c88;
      local_c30 = local_c78;
      local_c20 = local_c88;
      local_c18 = local_c78;
      local_c08 = local_c88;
      local_c00 = local_c78;
      local_be8 = local_c88;
      local_b90 = local_c88;
      local_b78 = local_c88;
      local_b68 = local_b80;
      local_b60 = local_f20._0_8_;
      uStack_b58 = local_f20._8_8_;
      uStack_b50 = local_f20._16_8_;
      uStack_b48 = local_f20._24_8_;
    }
    local_1270 = *(float *)(in_RDI + 0xd0);
    for (; fStack_126c = local_1270, fStack_1268 = local_1270, fStack_1264 = local_1270,
        local_125c = local_1270, local_1170 = local_1360, local_1100 = auVar41,
        local_10e0 = local_134c, local_10dc = local_134c, local_10d8 = local_134c,
        local_10d4 = local_134c, local_10d0 = local_134c, local_10cc = local_134c,
        local_10c8 = local_134c, local_10c4 = local_134c, local_13f0 = local_11d0,
        local_1420 + 3 < local_13b8; local_1420 = local_1420 + 4) {
      local_1258 = local_13c8;
      local_1200 = *(undefined8 *)*local_13c8;
      uStack_11f8 = *(undefined8 *)(*local_13c8 + 8);
      local_1238 = local_13c8;
      local_560 = ZEXT816(0) << 0x20;
      local_570 = 0;
      local_550._8_8_ = SUB168(ZEXT816(0),4);
      uStack_568 = local_550._8_8_;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_550._8_8_;
      local_1220 = vmaxps_avx(auVar38 << 0x40,*(undefined1 (*) [16])*local_13c8);
      local_530 = 0;
      uStack_528 = local_550._8_8_;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_550._8_8_;
      auVar1 = vminps_avx(auVar39 << 0x40,*(undefined1 (*) [16])*local_13c8);
      local_1230._0_8_ = auVar1._0_8_;
      local_1230._8_8_ = auVar1._8_8_;
      local_4d0 = 0x3f8000003f800000;
      uStack_4c8 = 0x3f8000003f800000;
      local_400 = local_1230._0_8_;
      uStack_3f8 = local_1230._8_8_;
      local_410 = 0x42b0c0a542b0c0a5;
      uStack_408 = 0x42b0c0a542b0c0a5;
      auVar27._8_8_ = 0x42b0c0a542b0c0a5;
      auVar27._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar27);
      local_490._0_8_ = auVar1._0_8_;
      local_430 = local_490._0_8_;
      local_490._8_8_ = auVar1._8_8_;
      uStack_428 = local_490._8_8_;
      local_440 = 0xc2b0c0a5c2b0c0a5;
      uStack_438 = 0xc2b0c0a5c2b0c0a5;
      auVar26._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7 = vmaxps_avx(auVar1,auVar26);
      local_490._0_8_ = auVar7._0_8_;
      uVar8 = local_490._0_8_;
      local_490._8_8_ = auVar7._8_8_;
      uVar9 = local_490._8_8_;
      local_330 = 0x3fb8aa3b3fb8aa3b;
      uStack_328 = 0x3fb8aa3b3fb8aa3b;
      local_320._0_4_ = auVar7._0_4_;
      local_320._4_4_ = auVar7._4_4_;
      uStack_318._0_4_ = auVar7._8_4_;
      uStack_318._4_4_ = auVar7._12_4_;
      local_4b0._4_4_ = local_320._4_4_ * 1.442695;
      local_4b0._0_4_ = (float)local_320 * 1.442695;
      uStack_4a8._0_4_ = (float)uStack_318 * 1.442695;
      uStack_4a8._4_4_ = uStack_318._4_4_ * 1.442695;
      local_3a0 = local_4b0;
      uStack_398 = uStack_4a8;
      local_3b0 = 0x3f0000003f000000;
      uStack_3a8 = 0x3f0000003f000000;
      local_4b0._0_4_ = (float)local_320 * 1.442695 + 0.5;
      local_4b0._4_4_ = local_320._4_4_ * 1.442695 + 0.5;
      fVar44 = (float)uStack_318 * 1.442695 + 0.5;
      fVar45 = uStack_318._4_4_ * 1.442695 + 0.5;
      uStack_4a8._0_4_ = fVar44;
      uStack_4a8._4_4_ = fVar45;
      local_2e0 = local_4b0;
      uStack_2d8 = uStack_4a8;
      local_4c0._4_4_ = (int)(float)local_4b0._4_4_;
      local_4c0._0_4_ = (int)(float)local_4b0._0_4_;
      local_4c0._8_4_ = (int)fVar44;
      local_4c0._12_4_ = (int)fVar45;
      local_2d0 = local_4c0._0_8_;
      uStack_2c8 = local_4c0._8_8_;
      auVar28._8_8_ = local_4c0._8_8_;
      auVar28._0_8_ = local_4c0._0_8_;
      auVar2 = vcvtdq2ps_avx(auVar28);
      local_4a0 = auVar2._0_8_;
      local_2b0 = local_4a0;
      uStack_498 = auVar2._8_8_;
      uStack_2a8 = uStack_498;
      local_2c0 = local_4b0;
      uStack_2b8 = uStack_4a8;
      auVar29._8_8_ = uStack_4a8;
      auVar29._0_8_ = local_4b0;
      auVar1 = vcmpps_avx(auVar29,auVar2,1);
      local_4e0._0_8_ = auVar1._0_8_;
      local_290 = local_4e0._0_8_;
      local_4e0._8_8_ = auVar1._8_8_;
      uStack_288 = local_4e0._8_8_;
      local_2a0 = 0x3f8000003f800000;
      uStack_298 = 0x3f8000003f800000;
      auVar30._8_8_ = 0x3f8000003f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      local_4e0 = vpand_avx(auVar1,auVar30);
      local_3e0 = local_4a0;
      uStack_3d8 = uStack_498;
      local_3f0 = local_4e0._0_8_;
      uStack_3e8 = local_4e0._8_8_;
      _local_4b0 = vsubps_avx(auVar2,local_4e0);
      local_270 = local_4b0;
      local_260 = ::_ps_cephes_exp_C1;
      local_280 = local_490;
      local_190 = local_4b0;
      uStack_188 = uStack_4a8;
      local_1a0[0] = 0.6933594;
      local_1a0[1] = 0.6933594;
      afStack_198[0] = 0.6933594;
      afStack_198[1] = 0.6933594;
      local_1b0 = local_490._0_8_;
      uStack_1a8 = local_490._8_8_;
      auVar31._8_4_ = 0.6933594;
      auVar31._12_4_ = 0.6933594;
      auVar31._0_4_ = 0.6933594;
      auVar31._4_4_ = 0.6933594;
      auVar1 = vfnmadd213ps_fma(auVar31,_local_4b0,auVar7);
      local_278 = ::_ps_cephes_exp_C2;
      local_160 = local_4b0;
      uStack_158 = uStack_4a8;
      local_170[0] = -0.00021219444;
      local_170[1] = -0.00021219444;
      afStack_168[0] = -0.00021219444;
      afStack_168[1] = -0.00021219444;
      local_490._0_8_ = auVar1._0_8_;
      local_180 = local_490._0_8_;
      local_490._8_8_ = auVar1._8_8_;
      uStack_178 = local_490._8_8_;
      auVar32._8_4_ = -0.00021219444;
      auVar32._12_4_ = -0.00021219444;
      auVar32._0_4_ = -0.00021219444;
      auVar32._4_4_ = -0.00021219444;
      local_490 = vfnmadd213ps_fma(auVar32,_local_4b0,auVar1);
      local_350 = local_490._0_8_;
      uStack_348 = local_490._8_8_;
      local_340._0_4_ = local_490._0_4_;
      local_340._4_4_ = local_490._4_4_;
      uStack_338._0_4_ = local_490._8_4_;
      uStack_338._4_4_ = local_490._12_4_;
      local_4a0._4_4_ = local_340._4_4_ * local_340._4_4_;
      local_4a0._0_4_ = (float)local_340 * (float)local_340;
      uStack_498._0_4_ = (float)uStack_338 * (float)uStack_338;
      uStack_498._4_4_ = uStack_338._4_4_ * uStack_338._4_4_;
      uStack_4e8 = 0x3950696739506967;
      local_4f0 = (undefined1  [8])0x3950696739506967;
      local_240 = local_4f0;
      local_1d8 = ::_ps_cephes_exp_p1;
      local_130 = 0x3950696739506967;
      uStack_128 = 0x3950696739506967;
      local_140 = local_490._0_8_;
      uStack_138 = local_490._8_8_;
      local_150[0] = 0.0013981999;
      local_150[1] = 0.0013981999;
      afStack_148[0] = 0.0013981999;
      afStack_148[1] = 0.0013981999;
      auVar33._8_4_ = 0.0013981999;
      auVar33._12_4_ = 0.0013981999;
      auVar33._0_4_ = 0.0013981999;
      auVar33._4_4_ = 0.0013981999;
      auVar1 = vfmadd213ps_fma(local_490,_local_4f0,auVar33);
      local_1f0 = ::_ps_cephes_exp_p2;
      local_4f0 = auVar1._0_8_;
      local_100 = local_4f0;
      uStack_4e8 = auVar1._8_8_;
      uStack_f8 = uStack_4e8;
      local_110 = local_490._0_8_;
      uStack_108 = local_490._8_8_;
      local_120[0] = 0.008333452;
      local_120[1] = 0.008333452;
      afStack_118[0] = 0.008333452;
      afStack_118[1] = 0.008333452;
      auVar34._8_4_ = 0.008333452;
      auVar34._12_4_ = 0.008333452;
      auVar34._0_4_ = 0.008333452;
      auVar34._4_4_ = 0.008333452;
      auVar1 = vfmadd213ps_fma(local_490,auVar1,auVar34);
      local_208 = ::_ps_cephes_exp_p3;
      local_4f0 = auVar1._0_8_;
      local_d0 = local_4f0;
      uStack_4e8 = auVar1._8_8_;
      uStack_c8 = uStack_4e8;
      local_e0 = local_490._0_8_;
      uStack_d8 = local_490._8_8_;
      local_f0[0] = 0.041665796;
      local_f0[1] = 0.041665796;
      afStack_e8[0] = 0.041665796;
      afStack_e8[1] = 0.041665796;
      auVar35._8_4_ = 0.041665796;
      auVar35._12_4_ = 0.041665796;
      auVar35._0_4_ = 0.041665796;
      auVar35._4_4_ = 0.041665796;
      auVar1 = vfmadd213ps_fma(local_490,auVar1,auVar35);
      local_220 = ::_ps_cephes_exp_p4;
      local_4f0 = auVar1._0_8_;
      local_a0 = local_4f0;
      uStack_4e8 = auVar1._8_8_;
      uStack_98 = uStack_4e8;
      local_b0 = local_490._0_8_;
      uStack_a8 = local_490._8_8_;
      local_c0[0] = 0.16666666;
      local_c0[1] = 0.16666666;
      afStack_b8[0] = 0.16666666;
      afStack_b8[1] = 0.16666666;
      auVar36._8_4_ = 0.16666666;
      auVar36._12_4_ = 0.16666666;
      auVar36._0_4_ = 0.16666666;
      auVar36._4_4_ = 0.16666666;
      auVar1 = vfmadd213ps_fma(local_490,auVar1,auVar36);
      local_238 = ::_ps_cephes_exp_p5;
      local_4f0 = auVar1._0_8_;
      local_70 = local_4f0;
      uStack_4e8 = auVar1._8_8_;
      uStack_68 = uStack_4e8;
      local_80 = local_490._0_8_;
      uStack_78 = local_490._8_8_;
      local_90[0] = 0.5;
      local_90[1] = 0.5;
      afStack_88[0] = 0.5;
      afStack_88[1] = 0.5;
      auVar37._8_4_ = 0.5;
      auVar37._12_4_ = 0.5;
      auVar37._0_4_ = 0.5;
      auVar37._4_4_ = 0.5;
      auVar1 = vfmadd213ps_fma(local_490,auVar1,auVar37);
      local_248 = local_4a0;
      local_4f0 = auVar1._0_8_;
      local_40 = local_4f0;
      uStack_4e8 = auVar1._8_8_;
      uStack_38 = uStack_4e8;
      local_50 = local_4a0;
      uStack_48 = uStack_498;
      local_60 = local_490._0_8_;
      uStack_58 = local_490._8_8_;
      auVar1 = vfmadd213ps_fma(_local_4a0,auVar1,local_490);
      local_4f0 = auVar1._0_8_;
      uVar10 = local_4f0;
      uStack_4e8 = auVar1._8_8_;
      uVar11 = uStack_4e8;
      local_3d0 = 0x3f8000003f800000;
      uStack_3c8 = 0x3f8000003f800000;
      local_3c0._0_4_ = auVar1._0_4_;
      local_3c0._4_4_ = auVar1._4_4_;
      uStack_3b8._0_4_ = auVar1._8_4_;
      uStack_3b8._4_4_ = auVar1._12_4_;
      local_4f0._4_4_ = local_3c0._4_4_ + 1.0;
      local_4f0._0_4_ = (float)local_3c0 + 1.0;
      uStack_4e8._0_4_ = (float)uStack_3b8 + 1.0;
      uStack_4e8._4_4_ = uStack_3b8._4_4_ + 1.0;
      local_2f0._0_4_ = local_4b0._0_4_;
      local_2f0._4_4_ = local_4b0._4_4_;
      uStack_2e8._0_4_ = local_4b0._8_4_;
      uStack_2e8._4_4_ = local_4b0._12_4_;
      local_4c0._4_4_ = (int)local_2f0._4_4_;
      local_4c0._0_4_ = (int)(float)local_2f0;
      local_4c0._8_4_ = (int)(float)uStack_2e8;
      local_4c0._12_4_ = (int)uStack_2e8._4_4_;
      local_470 = local_4c0._0_8_;
      uStack_468 = local_4c0._8_8_;
      local_480 = 0x7f0000007f;
      uStack_478 = 0x7f0000007f;
      auVar25._8_8_ = local_4c0._8_8_;
      auVar25._0_8_ = local_4c0._0_8_;
      auVar24._8_8_ = 0x7f0000007f;
      auVar24._0_8_ = 0x7f0000007f;
      auVar1 = vpaddd_avx(auVar25,auVar24);
      local_4c0._0_8_ = auVar1._0_8_;
      local_450 = local_4c0._0_8_;
      local_4c0._8_8_ = auVar1._8_8_;
      uStack_448 = local_4c0._8_8_;
      local_454 = 0x17;
      local_4c0 = vpslld_avx(auVar1,ZEXT416(0x17));
      local_1c0 = local_4c0._0_8_;
      uStack_1b8 = local_4c0._8_8_;
      local_500 = local_4c0._0_8_;
      uStack_4f8 = local_4c0._8_8_;
      local_360 = local_4f0;
      uStack_358 = uStack_4e8;
      local_370._0_4_ = local_4c0._0_4_;
      local_370._4_4_ = local_4c0._4_4_;
      uStack_368._0_4_ = local_4c0._8_4_;
      uStack_368._4_4_ = local_4c0._12_4_;
      local_4f0._4_4_ = (local_3c0._4_4_ + 1.0) * local_370._4_4_;
      local_4f0._0_4_ = ((float)local_3c0 + 1.0) * (float)local_370;
      uStack_4e8._0_4_ = ((float)uStack_3b8 + 1.0) * (float)uStack_368;
      uStack_4e8._4_4_ = (uStack_3b8._4_4_ + 1.0) * uStack_368._4_4_;
      local_510 = local_4f0;
      uStack_508 = uStack_4e8;
      local_11d4 = 0x3f800000;
      local_11f0 = 0x3f800000;
      local_520 = 0x3f8000003f800000;
      uStack_518 = 0x3f8000003f800000;
      auVar2._8_8_ = uStack_4e8;
      auVar2._0_8_ = local_4f0;
      auVar1._8_8_ = 0x3f8000003f800000;
      auVar1._0_8_ = 0x3f8000003f800000;
      local_1230 = vsubps_avx(auVar2,auVar1);
      local_310._0_4_ = local_1230._0_4_;
      local_310._4_4_ = local_1230._4_4_;
      uStack_308._0_4_ = local_1230._8_4_;
      uStack_308._4_4_ = local_1230._12_4_;
      local_390 = local_1270 * (float)local_310;
      fStack_38c = local_1270 * local_310._4_4_;
      fStack_388 = local_1270 * (float)uStack_308;
      fStack_384 = local_1270 * uStack_308._4_4_;
      local_380._0_4_ = local_1220._0_4_;
      local_380._4_4_ = local_1220._4_4_;
      fStack_378 = local_1220._8_4_;
      fStack_374 = local_1220._12_4_;
      local_1250 = (float)local_380._0_4_ + local_390;
      fStack_124c = (float)local_380._4_4_ + fStack_38c;
      fStack_1248 = fStack_378 + fStack_388;
      fStack_1244 = fStack_374 + fStack_384;
      *(ulong *)*local_13c8 = CONCAT44(fStack_124c,local_1250);
      *(ulong *)(*local_13c8 + 8) = CONCAT44(fStack_1244,fStack_1248);
      local_13c8 = (undefined1 (*) [32])(*local_13c8 + 0x10);
      local_1210 = CONCAT44(local_1270,local_1270);
      uStack_1208 = CONCAT44(local_1270,local_1270);
      uStack_11ec = local_11f0;
      uStack_11e8 = local_11f0;
      uStack_11e4 = local_11f0;
      local_580 = local_1200;
      uStack_578 = uStack_11f8;
      local_550 = local_560;
      local_540 = local_1200;
      uStack_538 = uStack_11f8;
      local_420 = local_560;
      local_3c0 = uVar10;
      uStack_3b8 = uVar11;
      _local_380 = local_1220;
      local_370 = local_4c0._0_8_;
      uStack_368 = local_4c0._8_8_;
      local_340 = local_350;
      uStack_338 = uStack_348;
      local_320 = uVar8;
      uStack_318 = uVar9;
      local_310 = local_1230._0_8_;
      uStack_308 = local_1230._8_8_;
      local_300 = CONCAT44(local_1270,local_1270);
      uStack_2f8 = CONCAT44(local_1270,local_1270);
      local_2f0 = local_4b0;
      uStack_2e8 = uStack_4a8;
      local_268 = local_280;
      local_258 = local_270;
      local_250 = local_280;
      local_230 = local_280;
      local_228 = local_240;
      local_218 = local_280;
      local_210 = local_240;
      local_200 = local_280;
      local_1f8 = local_240;
      local_1e8 = local_280;
      local_1e0 = local_240;
      local_1d0 = local_280;
      local_1c8 = local_240;
    }
    for (; local_1420 < local_13b8; local_1420 = local_1420 + 1) {
      if (*(float *)*local_13c8 < 0.0) {
        fVar44 = *(float *)(in_RDI + 0xd0);
        fVar45 = expf(*(float *)*local_13c8);
        *(float *)*local_13c8 = fVar44 * (fVar45 - 1.0);
      }
      local_13c8 = (undefined1 (*) [32])(*local_13c8 + 4);
    }
  }
  return 0;
}

Assistant:

int ELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}